

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Operation::Operation(Operation *this,char *name)

{
  Event *this_00;
  
  this->_vptr_Operation = (_func_int **)&PTR__Operation_01e74cf0;
  this->m_name = name;
  (this->m_deps).
  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_deps).
  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_deps).
  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (Event *)operator_new(0x18);
  Event::Event(this_00);
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&this->m_event,this_00);
  return;
}

Assistant:

Operation::Operation (const char* name)
	: m_name	(name)
	, m_event	(new Event)
{
}